

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *pNtk,int fDuplicate)

{
  undefined1 *puVar1;
  ulong uVar2;
  long *plVar3;
  Abc_Ntk_t *pAVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Abc_Obj_t *pAVar13;
  uint *puVar14;
  void *pvVar15;
  int *piVar16;
  uint *__ptr;
  long lVar17;
  Abc_Obj_t *pAVar18;
  void *pvVar19;
  Vec_Ptr_t *pVVar20;
  char *pcVar21;
  char *__s2;
  Abc_Obj_t *pAVar22;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 uVar23;
  undefined8 extraout_RDX_17;
  bool bVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int local_74;
  int local_5c;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x43d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
  }
  uVar7 = Abc_NtkLevel(pNtk);
  pVVar20 = pNtk->vCos;
  if (0 < pVVar20->nSize) {
    lVar27 = 0;
    do {
      pAVar22 = (Abc_Obj_t *)pVVar20->pArray[lVar27];
      pAVar18 = (Abc_Obj_t *)pAVar22->pNtk->vObjs->pArray[*(pAVar22->vFanins).pArray];
      iVar8 = Abc_NodeIsConst(pAVar18);
      if (iVar8 != 0) {
        uVar11 = *(uint *)&pAVar22->field_0x14;
        uVar9 = Abc_NodeIsConst0(pAVar18);
        if ((uVar11 >> 10 & 1) == uVar9) {
          pAVar13 = Abc_NtkCreateNodeConst1(pNtk);
        }
        else {
          pAVar13 = Abc_NtkCreateNodeConst0(pNtk);
        }
        if ((*(uint *)&pAVar22->field_0x14 >> 10 & 1) != 0) {
          *(uint *)&pAVar22->field_0x14 = *(uint *)&pAVar22->field_0x14 & 0xfffffbff;
        }
        Abc_ObjPatchFanin(pAVar22,pAVar18,pAVar13);
        if ((pAVar18->vFanouts).nSize == 0) {
          Abc_NtkDeleteObj(pAVar18);
        }
      }
      lVar27 = lVar27 + 1;
      pVVar20 = pNtk->vCos;
    } while (lVar27 < pVVar20->nSize);
  }
  puVar14 = (uint *)malloc(0x10);
  puVar14[0] = 100;
  puVar14[1] = 0;
  pvVar15 = malloc(800);
  *(void **)(puVar14 + 2) = pvVar15;
  uVar23 = extraout_RDX;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar8 = pNtk->vObjs->nSize;
    uVar2 = (long)iVar8 + 500;
    iVar12 = (int)uVar2;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar16 = (int *)malloc(uVar2 * 4);
      (pNtk->vTravIds).pArray = piVar16;
      if (piVar16 == (int *)0x0) goto LAB_0087e5b2;
      (pNtk->vTravIds).nCap = iVar12;
      uVar23 = extraout_RDX_00;
    }
    if (-500 < iVar8) {
      memset((pNtk->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
      uVar23 = extraout_RDX_01;
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar8 = pNtk->nTravIds;
  pNtk->nTravIds = iVar8 + 1;
  if (iVar8 < 0x3fffffff) {
    pVVar20 = pNtk->vCos;
    if (0 < pVVar20->nSize) {
      lVar27 = 0;
      do {
        plVar3 = (long *)pVVar20->pArray[lVar27];
        if ((*(byte *)((long)plVar3 + 0x15) & 4) != 0) {
          plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          lVar28 = *plVar3;
          iVar8 = (int)plVar3[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar28 + 0xe0),iVar8 + 1,(int)uVar23);
          if (((long)iVar8 < 0) || (*(int *)(lVar28 + 0xe4) <= iVar8)) goto LAB_0087e47c;
          lVar17 = *plVar3;
          iVar12 = *(int *)(lVar17 + 0xd8);
          uVar23 = extraout_RDX_02;
          if (*(int *)(*(long *)(lVar28 + 0xe8) + (long)iVar8 * 4) != iVar12) {
            iVar8 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar8 + 1,(int)extraout_RDX_02);
            if (((long)iVar8 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar8)) goto LAB_0087e4d9;
            *(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar8 * 4) = iVar12;
            uVar11 = puVar14[1];
            uVar9 = *puVar14;
            uVar23 = extraout_RDX_03;
            if (uVar11 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)(puVar14 + 2) == (void *)0x0) {
                  pvVar15 = malloc(0x80);
                  uVar23 = extraout_RDX_06;
                }
                else {
                  pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
                  uVar23 = extraout_RDX_04;
                }
                uVar10 = 0x10;
              }
              else {
                uVar10 = uVar9 * 2;
                if ((int)uVar10 <= (int)uVar9) goto LAB_0087dc7a;
                if (*(void **)(puVar14 + 2) == (void *)0x0) {
                  pvVar15 = malloc((ulong)uVar9 << 4);
                  uVar23 = extraout_RDX_07;
                }
                else {
                  pvVar15 = realloc(*(void **)(puVar14 + 2),(ulong)uVar9 << 4);
                  uVar23 = extraout_RDX_05;
                }
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = uVar10;
            }
LAB_0087dc7a:
            puVar14[1] = uVar11 + 1;
            *(long **)(*(long *)(puVar14 + 2) + (long)(int)uVar11 * 8) = plVar3;
          }
        }
        lVar27 = lVar27 + 1;
        pVVar20 = pNtk->vCos;
      } while (lVar27 < pVVar20->nSize);
    }
    uVar11 = puVar14[1];
    if ((long)(int)uVar11 < 1) {
      local_74 = 0;
    }
    else {
      __ptr = (uint *)malloc(0x10);
      __ptr[0] = 100;
      __ptr[1] = 0;
      pvVar15 = malloc(800);
      *(void **)(__ptr + 2) = pvVar15;
      lVar27 = *(long *)(puVar14 + 2);
      lVar28 = 0;
      local_74 = 0;
      local_5c = 0;
      do {
        pAVar22 = *(Abc_Obj_t **)(lVar27 + lVar28 * 8);
        lVar17 = (long)(pAVar22->vFanouts).nSize;
        if (lVar17 < 1) {
          bVar6 = true;
          bVar5 = true;
          bVar24 = true;
        }
        else {
          lVar25 = 0;
          bVar24 = false;
          bVar5 = false;
          bVar6 = false;
          do {
            uVar9 = *(uint *)((long)pAVar22->pNtk->vObjs->pArray[(pAVar22->vFanouts).pArray[lVar25]]
                             + 0x14);
            if ((uVar9 & 0xf) - 5 < 0xfffffffe) {
              bVar5 = true;
              if ((uVar9 >> 10 & 1) != 0) {
                __assert_fail("!Abc_ObjFaninC0(pNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                              ,0x468,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
              }
            }
            else if ((uVar9 >> 10 & 1) == 0) {
              bVar24 = true;
            }
            else {
              bVar6 = true;
            }
            lVar25 = lVar25 + 1;
          } while (lVar17 != lVar25);
          bVar6 = !bVar6;
          bVar24 = !bVar24;
          bVar5 = !bVar5;
        }
        if (bVar6) {
          __assert_fail("fHasInv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x471,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        uVar9 = *(uint *)&pAVar22->field_0x14 & 0xf;
        if ((((bVar24) && (uVar9 != 2)) && (uVar9 != 5)) &&
           ((bVar5 || (pNtk->ntkFunc != ABC_FUNC_MAP)))) {
          if (uVar9 != 7) {
            __assert_fail("Abc_ObjIsNode(pDriver)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x492,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          Abc_NodeComplement(pAVar22);
          if (0 < (pAVar22->vFanouts).nSize) {
            lVar17 = 0;
            do {
              pAVar18 = (Abc_Obj_t *)
                        pAVar22->pNtk->vObjs->pArray[(pAVar22->vFanouts).pArray[lVar17]];
              uVar9 = *(uint *)&pAVar18->field_0x14;
              if ((uVar9 & 0xf) - 5 < 0xfffffffe) {
                if ((uVar9 & 0xf) != 7) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                                ,0x49d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
                }
                Abc_NodeComplementInput(pAVar18,pAVar22);
              }
              else {
                if ((uVar9 >> 10 & 1) == 0) {
                  __assert_fail("Abc_ObjFaninC0(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                                ,0x498,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
                }
                *(uint *)&pAVar18->field_0x14 = uVar9 & 0xfffffbff;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (pAVar22->vFanouts).nSize);
          }
        }
        else {
          if ((fDuplicate == 0) || (*(uint *)&pAVar22->field_0x14 >> 0xc != uVar7 || uVar9 != 7)) {
            pAVar18 = Abc_NtkCreateNodeInv(pNtk,pAVar22);
            local_74 = local_74 + 1;
          }
          else {
            pAVar18 = Abc_NtkDupObj(pNtk,pAVar22,0);
            if (0 < (pAVar22->vFanins).nSize) {
              lVar17 = 0;
              do {
                Abc_ObjAddFanin(pAVar18,(Abc_Obj_t *)
                                        pAVar22->pNtk->vObjs->pArray
                                        [(pAVar22->vFanins).pArray[lVar17]]);
                lVar17 = lVar17 + 1;
              } while (lVar17 < (pAVar22->vFanins).nSize);
            }
            Abc_NodeComplement(pAVar18);
            local_5c = local_5c + 1;
          }
          __ptr[1] = 0;
          if (0 < (pAVar22->vFanouts).nSize) {
            lVar17 = 0;
            do {
              pvVar15 = pAVar22->pNtk->vObjs->pArray[(pAVar22->vFanouts).pArray[lVar17]];
              uVar9 = *(uint *)((long)pvVar15 + 0x14);
              if (((uVar9 >> 10 & 1) != 0) && (0xfffffffd < (uVar9 & 0xf) - 5)) {
                uVar9 = __ptr[1];
                uVar10 = *__ptr;
                if (uVar9 == uVar10) {
                  if ((int)uVar10 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar19 = malloc(0x80);
                    }
                    else {
                      pvVar19 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar26 = 0x10;
                  }
                  else {
                    uVar26 = uVar10 * 2;
                    if ((int)uVar26 <= (int)uVar10) goto LAB_0087dee8;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar19 = malloc((ulong)uVar10 << 4);
                    }
                    else {
                      pvVar19 = realloc(*(void **)(__ptr + 2),(ulong)uVar10 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar19;
                  *__ptr = uVar26;
                }
LAB_0087dee8:
                __ptr[1] = uVar9 + 1;
                *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar9 * 8) = pvVar15;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (pAVar22->vFanouts).nSize);
          }
          uVar9 = __ptr[1];
          if ((long)(int)uVar9 < 1) {
            __assert_fail("Vec_PtrSize(vFanouts) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x487,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          lVar17 = *(long *)(__ptr + 2);
          lVar25 = 0;
          do {
            pAVar13 = *(Abc_Obj_t **)(lVar17 + lVar25 * 8);
            puVar1 = &pAVar13->field_0x14;
            *(uint *)puVar1 = *(uint *)puVar1 ^ 0x400;
            Abc_ObjPatchFanin(pAVar13,pAVar22,pAVar18);
            uVar10 = *(uint *)&pAVar22->field_0x14 & 0xf;
            if (((uVar10 != 2) && (uVar10 != 5)) && ((pAVar22->vFanouts).nSize < 1)) {
              __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                            ,0x48c,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
            }
            lVar25 = lVar25 + 1;
          } while ((int)uVar9 != lVar25);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != (int)uVar11);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      local_74 = local_74 + local_5c;
    }
    if (*(void **)(puVar14 + 2) != (void *)0x0) {
      free(*(void **)(puVar14 + 2));
      puVar14[2] = 0;
      puVar14[3] = 0;
    }
    free(puVar14);
    puVar14 = (uint *)malloc(0x10);
    puVar14[0] = 100;
    puVar14[1] = 0;
    pvVar15 = malloc(800);
    *(void **)(puVar14 + 2) = pvVar15;
    uVar23 = extraout_RDX_08;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar2 = (long)iVar8 + 500;
      iVar12 = (int)uVar2;
      if ((pNtk->vTravIds).nCap < iVar12) {
        piVar16 = (int *)malloc(uVar2 * 4);
        (pNtk->vTravIds).pArray = piVar16;
        if (piVar16 == (int *)0x0) {
LAB_0087e5b2:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar12;
        uVar23 = extraout_RDX_09;
      }
      if (-500 < iVar8) {
        memset((pNtk->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
        uVar23 = extraout_RDX_10;
      }
      (pNtk->vTravIds).nSize = iVar12;
    }
    iVar8 = pNtk->nTravIds;
    pNtk->nTravIds = iVar8 + 1;
    if (iVar8 < 0x3fffffff) {
      pVVar20 = pNtk->vCos;
      if (0 < pVVar20->nSize) {
        lVar27 = 0;
        do {
          iVar8 = (int)uVar23;
          pAVar22 = (Abc_Obj_t *)pVVar20->pArray[lVar27];
          pAVar18 = (Abc_Obj_t *)pAVar22->pNtk->vObjs->pArray[*(pAVar22->vFanins).pArray];
          uVar11 = *(uint *)&pAVar18->field_0x14 & 0xf;
          if ((uVar11 == 5) || (uVar11 == 2)) {
            pcVar21 = Abc_ObjName(pAVar18);
            __s2 = Abc_ObjName(pAVar22);
            iVar12 = strcmp(pcVar21,__s2);
            iVar8 = (int)extraout_RDX_11;
            uVar23 = extraout_RDX_11;
            if (iVar12 == 0) goto LAB_0087e17d;
LAB_0087e1e4:
            uVar11 = puVar14[1];
            uVar9 = *puVar14;
            if (uVar11 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)(puVar14 + 2) == (void *)0x0) {
                  pvVar15 = malloc(0x80);
                  uVar23 = extraout_RDX_16;
                }
                else {
                  pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
                  uVar23 = extraout_RDX_13;
                }
                uVar10 = 0x10;
              }
              else {
                uVar10 = uVar9 * 2;
                if ((int)uVar10 <= (int)uVar9) goto LAB_0087e29e;
                if (*(void **)(puVar14 + 2) == (void *)0x0) {
                  pvVar15 = malloc((ulong)uVar9 << 4);
                  uVar23 = extraout_RDX_17;
                }
                else {
                  pvVar15 = realloc(*(void **)(puVar14 + 2),(ulong)uVar9 << 4);
                  uVar23 = extraout_RDX_15;
                }
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = uVar10;
            }
LAB_0087e29e:
            puVar14[1] = uVar11 + 1;
            *(Abc_Obj_t **)(*(long *)(puVar14 + 2) + (long)(int)uVar11 * 8) = pAVar22;
          }
          else {
LAB_0087e17d:
            pAVar4 = pAVar18->pNtk;
            iVar12 = pAVar18->Id;
            Vec_IntFillExtra(&pAVar4->vTravIds,iVar12 + 1,iVar8);
            if (((long)iVar12 < 0) || ((pAVar4->vTravIds).nSize <= iVar12)) {
LAB_0087e47c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((pAVar4->vTravIds).pArray[iVar12] == pAVar18->pNtk->nTravIds) {
              pAVar18 = pAVar18->pNext;
              pcVar21 = Abc_ObjName(pAVar22);
              iVar8 = strcmp((char *)pAVar18,pcVar21);
              uVar23 = extraout_RDX_12;
              if (iVar8 != 0) goto LAB_0087e1e4;
            }
            else {
              pAVar22 = (Abc_Obj_t *)Abc_ObjName(pAVar22);
              pAVar18->pNext = pAVar22;
              pAVar4 = pAVar18->pNtk;
              iVar8 = pAVar4->nTravIds;
              iVar12 = pAVar18->Id;
              Vec_IntFillExtra(&pAVar4->vTravIds,iVar12 + 1,Fill);
              if (((long)iVar12 < 0) || ((pAVar4->vTravIds).nSize <= iVar12)) {
LAB_0087e4d9:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (pAVar4->vTravIds).pArray[iVar12] = iVar8;
              uVar23 = extraout_RDX_14;
            }
          }
          lVar27 = lVar27 + 1;
          pVVar20 = pNtk->vCos;
        } while (lVar27 < pVVar20->nSize);
      }
      uVar11 = puVar14[1];
      if (0 < (long)(int)uVar11) {
        lVar27 = *(long *)(puVar14 + 2);
        lVar28 = 0;
        iVar8 = 0;
        iVar12 = 0;
        do {
          pAVar22 = *(Abc_Obj_t **)(lVar27 + lVar28 * 8);
          pAVar18 = (Abc_Obj_t *)pAVar22->pNtk->vObjs->pArray[*(pAVar22->vFanins).pArray];
          if (((fDuplicate == 0) || ((*(uint *)&pAVar18->field_0x14 & 0xf) != 7)) ||
             ((pNtk->ntkFunc != ABC_FUNC_MAP && (*(uint *)&pAVar18->field_0x14 >> 0xc != uVar7)))) {
            pAVar13 = Abc_NtkCreateNodeBuf(pNtk,pAVar18);
            pcVar21 = Abc_ObjName(pAVar18);
            Abc_ObjAssignName(pAVar13,pcVar21,"_buf");
            iVar12 = iVar12 + 1;
          }
          else {
            pAVar13 = Abc_NtkDupObj(pNtk,pAVar18,0);
            if (0 < (pAVar18->vFanins).nSize) {
              lVar17 = 0;
              do {
                Abc_ObjAddFanin(pAVar13,(Abc_Obj_t *)
                                        pAVar18->pNtk->vObjs->pArray
                                        [(pAVar18->vFanins).pArray[lVar17]]);
                lVar17 = lVar17 + 1;
              } while (lVar17 < (pAVar18->vFanins).nSize);
            }
            iVar8 = iVar8 + 1;
          }
          Abc_ObjPatchFanin(pAVar22,pAVar18,pAVar13);
          uVar9 = *(uint *)&pAVar18->field_0x14 & 0xf;
          if (((uVar9 != 2) && (uVar9 != 5)) && ((pAVar18->vFanouts).nSize < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x4e0,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != (int)uVar11);
        local_74 = iVar12 + local_74 + iVar8;
      }
      if (*(void **)(puVar14 + 2) != (void *)0x0) {
        free(*(void **)(puVar14 + 2));
        puVar14[2] = 0;
        puVar14[3] = 0;
      }
      free(puVar14);
      return local_74;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkLogicMakeSimpleCos( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int fAddBuffers = 1;
    Vec_Ptr_t * vDrivers, * vCoTerms;
    Abc_Obj_t * pNode, * pDriver, * pDriverNew, * pFanin;
    int i, k, LevelMax, nTotal = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    LevelMax = Abc_NtkLevel(pNtk);
//    Abc_NtkLogicMakeSimpleCosTest( pNtk, fDuplicate );

    // fix constant drivers
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( !Abc_NodeIsConst(pDriver) )
            continue;
        pDriverNew = (Abc_ObjFaninC0(pNode) == Abc_NodeIsConst0(pDriver)) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
        if ( Abc_ObjFaninC0(pNode) )
            Abc_ObjXorFaninC( pNode, 0 );
        Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
        if ( Abc_ObjFanoutNum(pDriver) == 0 )
            Abc_NtkDeleteObj( pDriver );
    }

    // collect drivers pointed by complemented edges
    vDrivers = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( !Abc_ObjFaninC0(pNode) )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdCurrent(pDriver) )
            continue;
        Abc_NodeSetTravIdCurrent(pDriver);
        Vec_PtrPush( vDrivers, pDriver );
    }
    // fix complemented drivers
    if ( Vec_PtrSize(vDrivers) > 0 )
    {
        int nDupGates = 0, nDupInvs = 0, nDupChange = 0;
        Vec_Ptr_t * vFanouts = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pDriver, i )
        {
            int fHasDir = 0, fHasInv = 0, fHasOther = 0;
            Abc_ObjForEachFanout( pDriver, pNode, k )
            {
                if ( !Abc_ObjIsCo(pNode) )
                {
                    assert( !Abc_ObjFaninC0(pNode) );
                    fHasOther = 1;
                    continue;
                }
                if ( Abc_ObjFaninC0(pNode) )
                    fHasInv = 1;
                else //if ( Abc_ObjFaninC0(pNode) )
                    fHasDir = 1;
            }
            assert( fHasInv );
            if ( Abc_ObjIsCi(pDriver) || fHasDir || (fHasOther && Abc_NtkHasMapping(pNtk)) ) // cannot change
            {
                // duplicate if critical
                if ( fDuplicate && Abc_ObjIsNode(pDriver) && Abc_ObjLevel(pDriver) == LevelMax )
                {
                    pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                    Abc_ObjForEachFanin( pDriver, pFanin, k )
                        Abc_ObjAddFanin( pDriverNew, pFanin );
                    Abc_NodeComplement( pDriverNew );
                    nDupGates++;
                }
                else // add inverter
                {
                    pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
                    nDupInvs++;
                }
                // collect CO fanouts to be redirected to the new node
                Vec_PtrClear( vFanouts );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                    if ( Abc_ObjIsCo(pNode) && Abc_ObjFaninC0(pNode) )
                        Vec_PtrPush( vFanouts, pNode );
                assert( Vec_PtrSize(vFanouts) > 0 );
                Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pNode, k )
                {
                    Abc_ObjXorFaninC( pNode, 0 );
                    Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
                    assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
                }
            }
            else // can change
            {
                // change polarity of the driver
                assert( Abc_ObjIsNode(pDriver) );
                Abc_NodeComplement( pDriver );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                {
                    if ( Abc_ObjIsCo(pNode) )
                    {
                        assert( Abc_ObjFaninC0(pNode) );
                        Abc_ObjXorFaninC( pNode, 0 );
                    }
                    else if ( Abc_ObjIsNode(pNode) )
                        Abc_NodeComplementInput( pNode, pDriver );
                    else assert( 0 );
                }
                nDupChange++;
            }
        }
        Vec_PtrFree( vFanouts );
//        printf( "Resolving inverted CO drivers: Invs = %d. Dups = %d. Changes = %d.\n",
//            nDupInvs, nDupGates, nDupChange );
        nTotal += nDupInvs + nDupGates;
    }
    Vec_PtrFree( vDrivers );

    // collect COs that needs fixing by adding buffers or duplicating
    vCoTerms = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    
    // The following cases should be addressed only if the network is written 
    // into a BLIF file. Otherwise, it is possible to skip them:
    // (1) if a CO points to a CI with a different name
    // (2) if an internal node drives more than one CO
    if ( fAddBuffers )
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // if the driver is a CI and has different name, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
    }
    // fix duplication problem
    if ( Vec_PtrSize(vCoTerms) > 0 )
    {
        int nDupBufs = 0, nDupGates = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vCoTerms, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            // duplicate if critical
            if ( fDuplicate && Abc_ObjIsNode(pDriver) && (Abc_NtkHasMapping(pNtk) || Abc_ObjLevel(pDriver) == LevelMax) )
            {
                pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                Abc_ObjForEachFanin( pDriver, pFanin, k )
                    Abc_ObjAddFanin( pDriverNew, pFanin );
                nDupGates++;
            }
            else // add buffer
            {
                pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );
                Abc_ObjAssignName( pDriverNew, Abc_ObjName(pDriver), "_buf" );
                nDupBufs++;
            }
            // swing the PO
            Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
            assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
        }
//        printf( "Resolving shared CO drivers: Bufs = %d. Dups = %d.\n", nDupBufs, nDupGates );
        nTotal += nDupBufs + nDupGates;
    }
    Vec_PtrFree( vCoTerms );
    return nTotal;
}